

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Cube::forward_impl
          (Cube *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_68;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_48;
  
  Tensor::operator*(&local_48,
                    *(xs->
                     super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                     _M_impl.super__Vector_impl_data._M_start);
  Tensor::operator*(&local_68,fx);
  if ((local_68.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value ==
       local_48.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value) &&
     (local_68.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value ==
      local_48.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value)) {
    uVar2 = local_68.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value *
            local_68.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value;
    uVar3 = uVar2;
    if ((((ulong)local_68.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar3 = (ulong)(-((uint)((ulong)local_68.
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                        .
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                        .m_data >> 2) & 0x3fffffff) & 0xf),
       (long)uVar2 <= (long)uVar3)) {
      uVar3 = uVar2;
    }
    uVar6 = uVar2 - uVar3;
    uVar4 = uVar6 + 0xf;
    if (-1 < (long)uVar6) {
      uVar4 = uVar6;
    }
    if (0 < (long)uVar3) {
      uVar7 = 0;
      do {
        fVar1 = local_48.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data[uVar7];
        local_68.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar7] = fVar1 * fVar1 * fVar1;
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
    lVar5 = (uVar4 & 0xfffffffffffffff0) + uVar3;
    if (0xf < (long)uVar6) {
      do {
        auVar9 = *(undefined1 (*) [64])
                  (local_48.
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_data + uVar3);
        auVar8 = vmulps_avx512f(auVar9,auVar9);
        auVar9 = vmulps_avx512f(auVar8,auVar9);
        *(undefined1 (*) [64])
         (local_68.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data + uVar3) = auVar9;
        uVar3 = uVar3 + 0x10;
      } while ((long)uVar3 < lVar5);
    }
    if (lVar5 < (long)uVar2) {
      do {
        fVar1 = local_48.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data[lVar5];
        local_68.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[lVar5] = fVar1 * fVar1 * fVar1;
        lVar5 = lVar5 + 1;
      } while (uVar2 - lVar5 != 0);
    }
    return;
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
               );
}

Assistant:

void Cube::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Square not yet implemented for CUDA");
#else
  auto x = **xs[0];
  (*fx).array() = x.array().cube();
#endif
}